

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketsOps.cpp
# Opt level: O1

void sznet::net::sockets::sz_listenordie(sz_sock sockfd)

{
  int iVar1;
  SourceFile file;
  Logger local_fd8;
  
  iVar1 = listen(sockfd,0x1000);
  if (iVar1 < 0) {
    file._8_8_ = 0xe;
    file.m_data = "SocketsOps.cpp";
    Logger::Logger(&local_fd8,file,0x10a,true);
    if (0x17 < (uint)(((int)&local_fd8 + 0xfb0) - (int)local_fd8.m_impl.m_stream.m_buffer.m_cur)) {
      builtin_strncpy(local_fd8.m_impl.m_stream.m_buffer.m_cur,"sockets::sz_listenordie",0x17);
      local_fd8.m_impl.m_stream.m_buffer.m_cur = local_fd8.m_impl.m_stream.m_buffer.m_cur + 0x17;
    }
    Logger::~Logger(&local_fd8);
  }
  return;
}

Assistant:

void sz_listenordie(sz_sock sockfd)
{
	int ret = ::listen(sockfd, SOMAXCONN);
	if (ret < 0)
	{
		LOG_SYSFATAL << "sockets::sz_listenordie";
	}
}